

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cc_cond(DisasCompare_conflict *c,DisasContext_conflict2 *s,int cond)

{
  CCOp_conflict CVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  TCGCond local_3c;
  CCOp_conflict op;
  TCGCond tcond;
  TCGv_i32 tmp2;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  int cond_local;
  DisasContext_conflict2 *s_local;
  DisasCompare_conflict *c_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  CVar1 = s->cc_op;
  if (((CVar1 == CC_OP_CMPB) || (CVar1 == CC_OP_CMPW)) || (CVar1 == CC_OP_CMPL)) {
    c->g2 = true;
    c->g1 = true;
    c->v1 = QREG_CC_N;
    c->v2 = QREG_CC_V;
    switch(cond) {
    case 2:
    case 3:
      local_3c = TCG_COND_LEU;
      break;
    case 4:
    case 5:
      local_3c = TCG_COND_LTU;
      break;
    case 6:
    case 7:
      local_3c = TCG_COND_EQ;
      break;
    default:
      goto LAB_008d02c4;
    case 10:
    case 0xb:
      c->g2 = false;
      c->g1 = false;
      pTVar2 = tcg_const_i32_m68k(tcg_ctx_00,0);
      c->v2 = pTVar2;
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      c->v1 = pTVar2;
      tcg_gen_sub_i32(tcg_ctx_00,pTVar2,QREG_CC_N,QREG_CC_V);
      gen_ext(tcg_ctx_00,pTVar2,pTVar2,CVar1 - CC_OP_CMPB,1);
    case 0xc:
    case 0xd:
      local_3c = TCG_COND_LT;
      break;
    case 0xe:
    case 0xf:
      local_3c = TCG_COND_LE;
    }
    goto LAB_008d0642;
  }
LAB_008d02c4:
  c->g1 = true;
  c->g2 = false;
  pTVar2 = tcg_const_i32_m68k(tcg_ctx_00,0);
  c->v2 = pTVar2;
  switch(cond) {
  case 0:
  case 1:
    c->v1 = c->v2;
    local_3c = TCG_COND_NEVER;
    goto LAB_008d0642;
  case 4:
  case 5:
    if (((CVar1 == CC_OP_ADDB) || (CVar1 == CC_OP_ADDW)) ||
       ((CVar1 == CC_OP_ADDL ||
        (((CVar1 == CC_OP_SUBB || (CVar1 == CC_OP_SUBW)) || (CVar1 == CC_OP_SUBL)))))) {
      local_3c = TCG_COND_NE;
      c->v1 = QREG_CC_X;
      goto LAB_008d0642;
    }
  case 8:
  case 9:
    if (CVar1 == CC_OP_LOGIC) {
      local_3c = TCG_COND_NEVER;
      c->v1 = c->v2;
      goto LAB_008d0642;
    }
    break;
  case 6:
  case 7:
    if (((((CVar1 == CC_OP_ADDB) || (CVar1 == CC_OP_ADDW)) || (CVar1 == CC_OP_ADDL)) ||
        ((CVar1 == CC_OP_SUBB || (CVar1 == CC_OP_SUBW)))) ||
       ((CVar1 == CC_OP_SUBL || (CVar1 == CC_OP_LOGIC)))) {
      local_3c = TCG_COND_EQ;
      c->v1 = QREG_CC_N;
      goto LAB_008d0642;
    }
    break;
  case 10:
  case 0xb:
switchD_008d030d_caseD_a:
    if ((((CVar1 == CC_OP_ADDB) || (CVar1 == CC_OP_ADDW)) ||
        ((CVar1 == CC_OP_ADDL || ((CVar1 == CC_OP_SUBB || (CVar1 == CC_OP_SUBW)))))) ||
       ((CVar1 == CC_OP_SUBL || (CVar1 == CC_OP_LOGIC)))) {
      c->v1 = QREG_CC_N;
      local_3c = TCG_COND_LT;
      goto LAB_008d0642;
    }
    break;
  case 0xc:
  case 0xd:
    if (CVar1 == CC_OP_LOGIC) goto switchD_008d030d_caseD_a;
    break;
  case 0xe:
  case 0xf:
    if (CVar1 == CC_OP_LOGIC) {
      c->v1 = QREG_CC_N;
      local_3c = TCG_COND_LE;
      goto LAB_008d0642;
    }
  }
  gen_flush_flags(s);
  switch(cond) {
  case 0:
  case 1:
  default:
    abort();
  case 2:
  case 3:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar2;
    c->g1 = false;
    tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_EQ,pTVar2,QREG_CC_Z,c->v2);
    tcg_gen_or_i32(tcg_ctx_00,pTVar2,pTVar2,QREG_CC_C);
    local_3c = TCG_COND_NE;
    break;
  case 4:
  case 5:
    c->v1 = QREG_CC_C;
    local_3c = TCG_COND_NE;
    break;
  case 6:
  case 7:
    c->v1 = QREG_CC_Z;
    local_3c = TCG_COND_EQ;
    break;
  case 8:
  case 9:
    c->v1 = QREG_CC_V;
    local_3c = TCG_COND_LT;
    break;
  case 10:
  case 0xb:
    c->v1 = QREG_CC_N;
    local_3c = TCG_COND_LT;
    break;
  case 0xc:
  case 0xd:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar2;
    c->g1 = false;
    tcg_gen_xor_i32(tcg_ctx_00,pTVar2,QREG_CC_N,QREG_CC_V);
    local_3c = TCG_COND_LT;
    break;
  case 0xe:
  case 0xf:
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar2;
    c->g1 = false;
    tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_EQ,pTVar2,QREG_CC_Z,c->v2);
    tcg_gen_neg_i32(tcg_ctx_00,pTVar2,pTVar2);
    ret = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_xor_i32(tcg_ctx_00,ret,QREG_CC_N,QREG_CC_V);
    tcg_gen_or_i32(tcg_ctx_00,pTVar2,pTVar2,ret);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    local_3c = TCG_COND_LT;
  }
LAB_008d0642:
  if ((cond & 1U) == 0) {
    local_3c = tcg_invert_cond(local_3c);
  }
  c->tcond = local_3c;
  return;
}

Assistant:

static void gen_cc_cond(DisasCompare *c, DisasContext *s, int cond)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp, tmp2;
    TCGCond tcond;
    CCOp op = s->cc_op;

    /* The CC_OP_CMP form can handle most normal comparisons directly.  */
    if (op == CC_OP_CMPB || op == CC_OP_CMPW || op == CC_OP_CMPL) {
        c->g1 = c->g2 = 1;
        c->v1 = QREG_CC_N;
        c->v2 = QREG_CC_V;
        switch (cond) {
        case 2: /* HI */
        case 3: /* LS */
            tcond = TCG_COND_LEU;
            goto done;
        case 4: /* CC */
        case 5: /* CS */
            tcond = TCG_COND_LTU;
            goto done;
        case 6: /* NE */
        case 7: /* EQ */
            tcond = TCG_COND_EQ;
            goto done;
        case 10: /* PL */
        case 11: /* MI */
            c->g1 = c->g2 = 0;
            c->v2 = tcg_const_i32(tcg_ctx, 0);
            c->v1 = tmp = tcg_temp_new(tcg_ctx);
            tcg_gen_sub_i32(tcg_ctx, tmp, QREG_CC_N, QREG_CC_V);
            gen_ext(tcg_ctx, tmp, tmp, op - CC_OP_CMPB, 1);
            /* fallthru */
        case 12: /* GE */
        case 13: /* LT */
            tcond = TCG_COND_LT;
            goto done;
        case 14: /* GT */
        case 15: /* LE */
            tcond = TCG_COND_LE;
            goto done;
        }
    }

    c->g1 = 1;
    c->g2 = 0;
    c->v2 = tcg_const_i32(tcg_ctx, 0);

    switch (cond) {
    case 0: /* T */
    case 1: /* F */
        c->v1 = c->v2;
        tcond = TCG_COND_NEVER;
        goto done;
    case 14: /* GT (!(Z || (N ^ V))) */
    case 15: /* LE (Z || (N ^ V)) */
        /*
         * Logic operations clear V, which simplifies LE to (Z || N),
         * and since Z and N are co-located, this becomes a normal
         * comparison vs N.
         */
        if (op == CC_OP_LOGIC) {
            c->v1 = QREG_CC_N;
            tcond = TCG_COND_LE;
            goto done;
        }
        break;
    case 12: /* GE (!(N ^ V)) */
    case 13: /* LT (N ^ V) */
        /* Logic operations clear V, which simplifies this to N.  */
        if (op != CC_OP_LOGIC) {
            break;
        }
        /* fallthru */
    case 10: /* PL (!N) */
    case 11: /* MI (N) */
        /* Several cases represent N normally.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL ||
            op == CC_OP_LOGIC) {
            c->v1 = QREG_CC_N;
            tcond = TCG_COND_LT;
            goto done;
        }
        break;
    case 6: /* NE (!Z) */
    case 7: /* EQ (Z) */
        /* Some cases fold Z into N.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL ||
            op == CC_OP_LOGIC) {
            tcond = TCG_COND_EQ;
            c->v1 = QREG_CC_N;
            goto done;
        }
        break;
    case 4: /* CC (!C) */
    case 5: /* CS (C) */
        /* Some cases fold C into X.  */
        if (op == CC_OP_ADDB || op == CC_OP_ADDW || op == CC_OP_ADDL ||
            op == CC_OP_SUBB || op == CC_OP_SUBW || op == CC_OP_SUBL) {
            tcond = TCG_COND_NE;
            c->v1 = QREG_CC_X;
            goto done;
        }
        /* fallthru */
    case 8: /* VC (!V) */
    case 9: /* VS (V) */
        /* Logic operations clear V and C.  */
        if (op == CC_OP_LOGIC) {
            tcond = TCG_COND_NEVER;
            c->v1 = c->v2;
            goto done;
        }
        break;
    }

    /* Otherwise, flush flag state to CC_OP_FLAGS.  */
    gen_flush_flags(s);

    switch (cond) {
    case 0: /* T */
    case 1: /* F */
    default:
        /* Invalid, or handled above.  */
        abort();
    case 2: /* HI (!C && !Z) -> !(C || Z)*/
    case 3: /* LS (C || Z) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_EQ, tmp, QREG_CC_Z, c->v2);
        tcg_gen_or_i32(tcg_ctx, tmp, tmp, QREG_CC_C);
        tcond = TCG_COND_NE;
        break;
    case 4: /* CC (!C) */
    case 5: /* CS (C) */
        c->v1 = QREG_CC_C;
        tcond = TCG_COND_NE;
        break;
    case 6: /* NE (!Z) */
    case 7: /* EQ (Z) */
        c->v1 = QREG_CC_Z;
        tcond = TCG_COND_EQ;
        break;
    case 8: /* VC (!V) */
    case 9: /* VS (V) */
        c->v1 = QREG_CC_V;
        tcond = TCG_COND_LT;
        break;
    case 10: /* PL (!N) */
    case 11: /* MI (N) */
        c->v1 = QREG_CC_N;
        tcond = TCG_COND_LT;
        break;
    case 12: /* GE (!(N ^ V)) */
    case 13: /* LT (N ^ V) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_xor_i32(tcg_ctx, tmp, QREG_CC_N, QREG_CC_V);
        tcond = TCG_COND_LT;
        break;
    case 14: /* GT (!(Z || (N ^ V))) */
    case 15: /* LE (Z || (N ^ V)) */
        c->v1 = tmp = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_EQ, tmp, QREG_CC_Z, c->v2);
        tcg_gen_neg_i32(tcg_ctx, tmp, tmp);
        tmp2 = tcg_temp_new(tcg_ctx);
        tcg_gen_xor_i32(tcg_ctx, tmp2, QREG_CC_N, QREG_CC_V);
        tcg_gen_or_i32(tcg_ctx, tmp, tmp, tmp2);
        tcg_temp_free(tcg_ctx, tmp2);
        tcond = TCG_COND_LT;
        break;
    }

 done:
    if ((cond & 1) == 0) {
        tcond = tcg_invert_cond(tcond);
    }
    c->tcond = tcond;
}